

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O3

void gtk_round_down_box(int x,int y,int w,int h,Fl_Color c)

{
  uint uVar1;
  uint uVar2;
  Fl_Color FVar3;
  _func_int **pp_Var5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar4;
  
  Fl::set_box_color(c);
  if (w < 5) {
    uVar1 = (w - (w + -1 >> 0x1f)) - 1;
    iVar9 = (int)uVar1 >> 1;
    uVar1 = uVar1 & 0xfffffffe;
  }
  else {
    iVar9 = 2;
    uVar1 = 4;
  }
  if (h <= (int)uVar1) {
    uVar1 = (h - (h + -1 >> 0x1f)) - 1;
    iVar9 = (int)uVar1 >> 1;
    uVar1 = uVar1 & 0xfffffffe;
  }
  uVar11 = w - uVar1;
  uVar1 = h - uVar1;
  uVar7 = uVar11;
  if (h < w) {
    uVar7 = uVar1;
  }
  if (1 < (int)uVar7) {
    uVar2 = x + iVar9;
    uVar4 = (ulong)uVar2;
    uVar10 = iVar9 + y;
    iVar9 = -0x5a;
    if (w <= h) {
      iVar9 = 0;
    }
    iVar6 = 0xb4;
    if (h < w) {
      iVar6 = 0x5a;
    }
    iVar8 = 0x168;
    if (h < w) {
      iVar8 = 0x10e;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar9,fl_graphics_driver,(ulong)((uVar2 + uVar11) - uVar7),(ulong)uVar10,
               (ulong)uVar7,(ulong)uVar7);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              ((double)iVar6,(double)iVar8,fl_graphics_driver,uVar4,
               (ulong)((uVar1 + uVar10) - uVar7),(ulong)uVar7,(ulong)uVar7);
    if (w < h) {
      uVar10 = (uVar7 >> 1) + uVar10;
      uVar1 = uVar1 - (uVar7 & 0x7ffffffe);
      pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    }
    else {
      if (w <= h) goto LAB_001eeee3;
      uVar4 = (ulong)((uVar1 >> 1) + uVar2);
      uVar11 = uVar11 - (uVar1 & 0x7ffffffe);
      pp_Var5 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
    }
    (*pp_Var5[4])(fl_graphics_driver,uVar4,(ulong)uVar10,(ulong)uVar11,(ulong)uVar1);
  }
LAB_001eeee3:
  FVar3 = fl_color_average(0x38,c,0.05);
  Fl::set_box_color(FVar3);
  draw(0,x,y,w,h,2);
  draw(0,x + 1,y,w + -2,h,1);
  FVar3 = fl_color_average(0x38,c,0.1);
  Fl::set_box_color(FVar3);
  draw(0,x,y,w,h,1);
  draw(0,x + 1,y,w + -2,h,0);
  FVar3 = fl_color_average(0x38,c,0.5);
  Fl::set_box_color(FVar3);
  draw(2,x,y,w,h,0);
  return;
}

Assistant:

static void gtk_round_down_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(c);
  draw(FILL,	    x,   y, w,   h, 2);

  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  draw(UPPER_LEFT,  x,   y, w,   h, 2);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 1);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  draw(UPPER_LEFT,  x,   y, w,   h, 1);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 0);

  gtk_color(fl_color_average(FL_BLACK, c, 0.5f));
  draw(CLOSED,	    x,   y, w,   h, 0);
}